

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::updateAPF(HFactor *this,HVector *aq,HVector *ep,HighsInt iRow)

{
  int iVar1;
  vector<int,_std::allocator<int>_> *this_00;
  value_type_conflict1 *__x;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  HighsInt i_1;
  HighsInt k;
  HighsInt variable_out;
  HighsInt i;
  value_type_conflict1 *in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  value_type_conflict1 *in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  undefined4 local_48;
  undefined4 local_34;
  undefined4 local_20;
  
  for (local_20 = 0; local_20 < *(int *)(in_RSI + 0x7c); local_20 = local_20 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x80),(long)local_20);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
               (value_type_conflict2 *)in_stack_ffffffffffffff78);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x98),(long)local_20);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  iVar1 = *(int *)(*(long *)(in_RDI + 0x100) + (long)in_ECX * 4);
  if (iVar1 < *(int *)(in_RDI + 0xcc)) {
    for (local_34 = *(int *)(*(long *)(in_RDI + 0xe8) + (long)iVar1 * 4);
        local_34 < *(int *)(*(long *)(in_RDI + 0xe8) + (long)(iVar1 + 1) * 4);
        local_34 = local_34 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
                 (value_type_conflict2 *)in_stack_ffffffffffffff78);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
  }
  else {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
               (value_type_conflict2 *)in_stack_ffffffffffffff68);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  std::vector<int,_std::allocator<int>_>::size
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x698));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
             (value_type_conflict2 *)in_stack_ffffffffffffff68);
  for (local_48 = 0; local_48 < *(int *)(in_RDX + 0x7c); local_48 = local_48 + 1) {
    in_stack_ffffffffffffff80 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x698);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDX + 0x80),(long)local_48);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
               (value_type_conflict2 *)in_stack_ffffffffffffff78);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x98),(long)local_48);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x680);
  std::vector<int,_std::allocator<int>_>::size
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x698));
  std::vector<int,_std::allocator<int>_>::push_back
            (this_00,(value_type_conflict2 *)in_stack_ffffffffffffff68);
  __x = (value_type_conflict1 *)(in_RDI + 0x650);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)in_ECX);
  std::vector<double,_std::allocator<double>_>::push_back(in_stack_ffffffffffffff80,__x);
  return;
}

Assistant:

void HFactor::updateAPF(HVector* aq, HVector* ep, HighsInt iRow
                        //, HighsInt* hint
) {
  // Store elements
  for (HighsInt i = 0; i < aq->packCount; i++) {
    pf_index.push_back(aq->packIndex[i]);
    pf_value.push_back(aq->packValue[i]);
  }

  HighsInt variable_out = basic_index[iRow];
  if (variable_out >= num_col) {
    pf_index.push_back(variable_out - num_col);
    pf_value.push_back(-1);
  } else {
    for (HighsInt k = a_start[variable_out]; k < a_start[variable_out + 1];
         k++) {
      pf_index.push_back(a_index[k]);
      pf_value.push_back(-a_value[k]);
    }
  }
  pf_start.push_back(pf_index.size());

  for (HighsInt i = 0; i < ep->packCount; i++) {
    pf_index.push_back(ep->packIndex[i]);
    pf_value.push_back(ep->packValue[i]);
  }
  pf_start.push_back(pf_index.size());

  // Store pivot
  pf_pivot_value.push_back(aq->array[iRow]);
}